

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_sequential_decoder.cc
# Opt level: O0

bool __thiscall draco::MeshSequentialDecoder::DecodeConnectivity(MeshSequentialDecoder *this)

{
  bool bVar1;
  uint16_t uVar2;
  Mesh *this_00;
  DecoderBuffer *this_01;
  int64_t iVar3;
  reference pvVar4;
  PointCloud *this_02;
  MeshDecoder *in_RDI;
  uint32_t val_3;
  int j_3;
  Face face_3;
  uint32_t i_3;
  uint32_t val_2;
  int j_2;
  Face face_2;
  uint32_t i_2;
  uint16_t val_1;
  int j_1;
  Face face_1;
  uint32_t i_1;
  uint8_t val;
  int j;
  Face face;
  uint32_t i;
  uint8_t connectivity_method;
  uint64_t faces_64;
  uint32_t num_points;
  uint32_t num_faces;
  Face *in_stack_ffffffffffffff58;
  uint *in_stack_ffffffffffffff60;
  array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *in_stack_ffffffffffffff70
  ;
  int local_88;
  uint local_78;
  uint local_74;
  int local_70;
  uint local_60;
  uint local_5c;
  ushort local_56;
  int local_54;
  uint local_44;
  uint local_40;
  byte local_39;
  int local_38;
  uint local_28;
  char local_21;
  Mesh *local_20;
  uint local_18;
  uint local_14;
  MeshDecoder *pMVar5;
  uint32_t num_faces_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  pMVar5 = in_RDI;
  uVar2 = PointCloudDecoder::bitstream_version(&in_RDI->super_PointCloudDecoder);
  num_faces_00 = (uint32_t)((ulong)pMVar5 >> 0x20);
  if (uVar2 < 0x202) {
    PointCloudDecoder::buffer(&in_RDI->super_PointCloudDecoder);
    bVar1 = DecoderBuffer::Decode<unsigned_int>((DecoderBuffer *)in_RDI,in_stack_ffffffffffffff60);
    if (!bVar1) {
      return false;
    }
    PointCloudDecoder::buffer(&in_RDI->super_PointCloudDecoder);
    bVar1 = DecoderBuffer::Decode<unsigned_int>((DecoderBuffer *)in_RDI,in_stack_ffffffffffffff60);
    if (!bVar1) {
      return false;
    }
  }
  else {
    PointCloudDecoder::buffer(&in_RDI->super_PointCloudDecoder);
    bVar1 = DecodeVarint<unsigned_int>((uint *)in_stack_ffffffffffffff58,(DecoderBuffer *)0x18093d);
    if (!bVar1) {
      return false;
    }
    PointCloudDecoder::buffer(&in_RDI->super_PointCloudDecoder);
    bVar1 = DecodeVarint<unsigned_int>((uint *)in_stack_ffffffffffffff58,(DecoderBuffer *)0x180968);
    if (!bVar1) {
      return false;
    }
  }
  this_00 = (Mesh *)(ulong)local_14;
  if (this_00 < (Mesh *)0x55555556) {
    local_20 = this_00;
    this_01 = PointCloudDecoder::buffer(&in_RDI->super_PointCloudDecoder);
    iVar3 = DecoderBuffer::remaining_size(this_01);
    if ((Mesh *)(iVar3 / 3) < this_00) {
      bVar1 = false;
    }
    else {
      PointCloudDecoder::buffer(&in_RDI->super_PointCloudDecoder);
      bVar1 = DecoderBuffer::Decode<unsigned_char>((DecoderBuffer *)in_RDI,(uchar *)this_00);
      if (bVar1) {
        if (local_21 == '\0') {
          bVar1 = DecodeAndDecompressIndices
                            ((MeshSequentialDecoder *)
                             CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                             num_faces_00);
          if (!bVar1) {
            return false;
          }
        }
        else if (local_18 < 0x100) {
          for (local_28 = 0; local_28 < local_14; local_28 = local_28 + 1) {
            std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::array
                      (in_stack_ffffffffffffff70);
            for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
              PointCloudDecoder::buffer(&in_RDI->super_PointCloudDecoder);
              bVar1 = DecoderBuffer::Decode<unsigned_char>((DecoderBuffer *)in_RDI,(uchar *)this_00)
              ;
              if (!bVar1) {
                return false;
              }
              local_40 = (uint)local_39;
              pvVar4 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                       ::operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                                     *)this_00,(size_type)in_stack_ffffffffffffff58);
              IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator=(pvVar4,&local_40);
            }
            MeshDecoder::mesh(in_RDI);
            Mesh::AddFace(this_00,in_stack_ffffffffffffff58);
          }
        }
        else if (local_18 < 0x10000) {
          for (local_44 = 0; local_44 < local_14; local_44 = local_44 + 1) {
            std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::array
                      (in_stack_ffffffffffffff70);
            for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
              PointCloudDecoder::buffer(&in_RDI->super_PointCloudDecoder);
              bVar1 = DecoderBuffer::Decode<unsigned_short>
                                ((DecoderBuffer *)in_RDI,(unsigned_short *)this_00);
              if (!bVar1) {
                return false;
              }
              local_5c = (uint)local_56;
              pvVar4 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                       ::operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                                     *)this_00,(size_type)in_stack_ffffffffffffff58);
              IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator=(pvVar4,&local_5c);
            }
            MeshDecoder::mesh(in_RDI);
            Mesh::AddFace(this_00,in_stack_ffffffffffffff58);
          }
        }
        else if ((local_18 < 0x200000) &&
                (uVar2 = PointCloudDecoder::bitstream_version(&in_RDI->super_PointCloudDecoder),
                0x201 < uVar2)) {
          for (local_60 = 0; local_60 < local_14; local_60 = local_60 + 1) {
            std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::array
                      (in_stack_ffffffffffffff70);
            for (local_70 = 0; local_70 < 3; local_70 = local_70 + 1) {
              PointCloudDecoder::buffer(&in_RDI->super_PointCloudDecoder);
              bVar1 = DecodeVarint<unsigned_int>
                                ((uint *)in_stack_ffffffffffffff58,(DecoderBuffer *)0x180c57);
              if (!bVar1) {
                return false;
              }
              pvVar4 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                       ::operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                                     *)this_00,(size_type)in_stack_ffffffffffffff58);
              IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator=(pvVar4,&local_74);
            }
            MeshDecoder::mesh(in_RDI);
            Mesh::AddFace(this_00,in_stack_ffffffffffffff58);
          }
        }
        else {
          for (local_78 = 0; local_78 < local_14; local_78 = local_78 + 1) {
            std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::array
                      (in_stack_ffffffffffffff70);
            for (local_88 = 0; local_88 < 3; local_88 = local_88 + 1) {
              PointCloudDecoder::buffer(&in_RDI->super_PointCloudDecoder);
              bVar1 = DecoderBuffer::Decode<unsigned_int>((DecoderBuffer *)in_RDI,(uint *)this_00);
              if (!bVar1) {
                return false;
              }
              pvVar4 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                       ::operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                                     *)this_00,(size_type)in_stack_ffffffffffffff58);
              IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator=
                        (pvVar4,(uint *)&stack0xffffffffffffff74);
            }
            MeshDecoder::mesh(in_RDI);
            Mesh::AddFace(this_00,in_stack_ffffffffffffff58);
          }
        }
        this_02 = PointCloudDecoder::point_cloud(&in_RDI->super_PointCloudDecoder);
        PointCloud::set_num_points(this_02,local_18);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MeshSequentialDecoder::DecodeConnectivity() {
  uint32_t num_faces;
  uint32_t num_points;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    if (!buffer()->Decode(&num_faces)) {
      return false;
    }
    if (!buffer()->Decode(&num_points)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_faces, buffer())) {
      return false;
    }
    if (!DecodeVarint(&num_points, buffer())) {
      return false;
    }
  }

  // Check that num_faces and num_points are valid values.
  const uint64_t faces_64 = static_cast<uint64_t>(num_faces);
  // Compressed sequential encoding can only handle (2^32 - 1) / 3 indices.
  if (faces_64 > 0xffffffff / 3) {
    return false;
  }
  if (faces_64 > buffer()->remaining_size() / 3) {
    // The number of faces is unreasonably high, because face indices do not
    // fit in the remaining size of the buffer.
    return false;
  }
  uint8_t connectivity_method;
  if (!buffer()->Decode(&connectivity_method)) {
    return false;
  }
  if (connectivity_method == 0) {
    if (!DecodeAndDecompressIndices(num_faces)) {
      return false;
    }
  } else {
    if (num_points < 256) {
      // Decode indices as uint8_t.
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint8_t val;
          if (!buffer()->Decode(&val)) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    } else if (num_points < (1 << 16)) {
      // Decode indices as uint16_t.
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint16_t val;
          if (!buffer()->Decode(&val)) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    } else if (num_points < (1 << 21) &&
               bitstream_version() >= DRACO_BITSTREAM_VERSION(2, 2)) {
      // Decode indices as uint32_t.
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint32_t val;
          if (!DecodeVarint(&val, buffer())) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    } else {
      // Decode faces as uint32_t (default).
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint32_t val;
          if (!buffer()->Decode(&val)) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    }
  }
  point_cloud()->set_num_points(num_points);
  return true;
}